

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  Type TVar5;
  uint32 uVar6;
  uint32 uVar7;
  UnknownField *this;
  uint64 uVar8;
  size_t __n;
  void *__src;
  UnknownFieldSet *unknown_fields_00;
  uint8 *puVar9;
  uint uVar10;
  EpsCopyOutputStream *in_RDX;
  byte *in_RSI;
  UnknownField *field;
  int i;
  ptrdiff_t size;
  uint8 **in_stack_fffffffffffffe38;
  EpsCopyOutputStream *in_stack_fffffffffffffe40;
  EpsCopyOutputStream *this_00;
  undefined4 in_stack_fffffffffffffe88;
  int iVar11;
  int iVar12;
  EpsCopyOutputStream *pEVar13;
  byte *local_18;
  uint local_c;
  byte *local_8;
  
  iVar11 = 0;
  while (iVar12 = iVar11, iVar4 = UnknownFieldSet::field_count((UnknownFieldSet *)0x465e10),
        iVar11 < iVar4) {
    this = UnknownFieldSet::field
                     ((UnknownFieldSet *)in_stack_fffffffffffffe40,
                      (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    TVar5 = UnknownField::type(this);
    pEVar13 = in_RDX;
    switch(TVar5) {
    case TYPE_VARINT:
      iVar11 = UnknownField::number(this);
      uVar8 = UnknownField::varint(this);
      uVar7 = WireFormatLite::MakeTag(iVar11,WIRETYPE_VARINT);
      puVar9 = io::CodedOutputStream::WriteVarint32ToArray(uVar7,in_RSI);
      in_RSI = io::CodedOutputStream::WriteVarint64ToArray(uVar8,puVar9);
      pEVar13 = in_RDX;
      break;
    case TYPE_FIXED32:
      iVar11 = UnknownField::number(this);
      uVar7 = UnknownField::fixed32(this);
      uVar6 = WireFormatLite::MakeTag(iVar11,WIRETYPE_FIXED32);
      puVar9 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,in_RSI);
      in_RSI = io::CodedOutputStream::WriteLittleEndian32ToArray(uVar7,puVar9);
      pEVar13 = in_RDX;
      break;
    case TYPE_FIXED64:
      iVar11 = UnknownField::number(this);
      uVar8 = UnknownField::fixed64(this);
      uVar7 = WireFormatLite::MakeTag(iVar11,WIRETYPE_FIXED64);
      puVar9 = io::CodedOutputStream::WriteVarint32ToArray(uVar7,in_RSI);
      in_RSI = io::CodedOutputStream::WriteLittleEndian64ToArray(uVar8,puVar9);
      pEVar13 = in_RDX;
      break;
    case TYPE_LENGTH_DELIMITED:
      uVar6 = UnknownField::number(this);
      UnknownField::length_delimited_abi_cxx11_(this);
      uVar7 = uVar6;
      this_00 = in_RDX;
      __n = std::__cxx11::string::size();
      bVar1 = true;
      if ((long)__n < 0x80) {
        in_stack_fffffffffffffe40 =
             (EpsCopyOutputStream *)((*(long *)&this_00->end_ - (long)in_RSI) + 0x10);
        iVar11 = io::EpsCopyOutputStream::TagSize(uVar6 << 3);
        bVar1 = (long)in_stack_fffffffffffffe40 + (-1 - (long)iVar11) < (long)__n;
      }
      if (bVar1) {
        in_RSI = io::EpsCopyOutputStream::WriteStringOutline
                           (this_00,uVar7,(string *)in_RDX,(uint8 *)in_stack_fffffffffffffe40);
      }
      else {
        uVar10 = uVar6 << 3 | 2;
        bVar3 = (byte)uVar10;
        if (uVar10 < 0x80) {
          *in_RSI = bVar3;
          local_8 = in_RSI + 1;
        }
        else {
          *in_RSI = bVar3 | 0x80;
          local_c = (uVar6 << 3) >> 7;
          if (local_c < 0x80) {
            in_RSI[1] = (byte)local_c;
            local_8 = in_RSI + 2;
          }
          else {
            pbVar2 = in_RSI + 1;
            do {
              local_18 = pbVar2;
              *local_18 = (byte)local_c | 0x80;
              local_c = local_c >> 7;
              pbVar2 = local_18 + 1;
            } while (0x7f < local_c);
            local_8 = local_18 + 2;
            local_18[1] = (byte)local_c;
          }
        }
        *local_8 = (byte)__n;
        in_stack_fffffffffffffe38 = (uint8 **)(local_8 + 1);
        __src = (void *)std::__cxx11::string::data();
        memcpy(in_stack_fffffffffffffe38,__src,__n);
        in_RSI = (byte *)((long)(local_8 + 1) + __n);
      }
      break;
    case TYPE_GROUP:
      iVar11 = UnknownField::number(this);
      uVar7 = WireFormatLite::MakeTag(iVar11,WIRETYPE_START_GROUP);
      unknown_fields_00 =
           (UnknownFieldSet *)io::CodedOutputStream::WriteVarint32ToArray(uVar7,in_RSI);
      UnknownField::group(this);
      puVar9 = InternalSerializeUnknownFieldsToArray
                         (unknown_fields_00,(uint8 *)in_RDX,
                          (EpsCopyOutputStream *)CONCAT44(iVar12,in_stack_fffffffffffffe88));
      io::EpsCopyOutputStream::EnsureSpace(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      iVar11 = UnknownField::number(this);
      uVar7 = WireFormatLite::MakeTag(iVar11,WIRETYPE_END_GROUP);
      in_RSI = io::CodedOutputStream::WriteVarint32ToArray(uVar7,puVar9);
      pEVar13 = in_RDX;
    }
    in_RDX = pEVar13;
    iVar11 = iVar12 + 1;
  }
  return in_RSI;
}

Assistant:

uint8* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    stream->EnsureSpace(&target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        stream->EnsureSpace(&target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}